

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O1

unique_ptr<absl::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::time_internal::cctz::TimeZoneInfo>_>
 absl::time_internal::cctz::TimeZoneInfo::UTC(void)

{
  TimeZoneInfo *this;
  __uniq_ptr_data<absl::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::time_internal::cctz::TimeZoneInfo>,_true,_true>
  in_RDI;
  seconds local_10;
  
  this = (TimeZoneInfo *)operator_new(0xc0);
  (this->super_TimeZoneIf)._vptr_TimeZoneIf = (_func_int **)&PTR__TimeZoneInfo_001950d0;
  (this->transitions_).
  super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transitions_).
  super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transitions_).
  super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transition_types_).
  super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transition_types_).
  super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transition_types_).
  super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->abbreviations_)._M_dataplus._M_p = (pointer)&(this->abbreviations_).field_2;
  (this->abbreviations_)._M_string_length = 0;
  (this->abbreviations_).field_2._M_local_buf[0] = '\0';
  (this->version_)._M_dataplus._M_p = (pointer)&(this->version_).field_2;
  (this->version_)._M_string_length = 0;
  (this->version_).field_2._M_local_buf[0] = '\0';
  (this->future_spec_)._M_dataplus._M_p = (pointer)&(this->future_spec_).field_2;
  (this->future_spec_)._M_string_length = 0;
  (this->future_spec_).field_2._M_local_buf[0] = '\0';
  (this->local_time_hint_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->time_local_hint_).super___atomic_base<unsigned_long>._M_i = 0;
  *(TimeZoneInfo **)
   in_RDI.
   super___uniq_ptr_impl<absl::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::time_internal::cctz::TimeZoneInfo>_>
   ._M_t.
   super__Tuple_impl<0UL,_absl::time_internal::cctz::TimeZoneInfo_*,_std::default_delete<absl::time_internal::cctz::TimeZoneInfo>_>
   .super__Head_base<0UL,_absl::time_internal::cctz::TimeZoneInfo_*,_false>._M_head_impl = this;
  local_10.__r = 0;
  ResetToBuiltinUTC(this,&local_10);
  return (__uniq_ptr_data<absl::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::time_internal::cctz::TimeZoneInfo>,_true,_true>
          )(tuple<absl::time_internal::cctz::TimeZoneInfo_*,_std::default_delete<absl::time_internal::cctz::TimeZoneInfo>_>
            )in_RDI.
             super___uniq_ptr_impl<absl::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::time_internal::cctz::TimeZoneInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::time_internal::cctz::TimeZoneInfo_*,_std::default_delete<absl::time_internal::cctz::TimeZoneInfo>_>
             .super__Head_base<0UL,_absl::time_internal::cctz::TimeZoneInfo_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<TimeZoneInfo> TimeZoneInfo::UTC() {
  auto tz = std::unique_ptr<TimeZoneInfo>(new TimeZoneInfo);
  tz->ResetToBuiltinUTC(seconds::zero());
  return tz;
}